

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_tool.h
# Opt level: O2

String * __thiscall
Json::codePointToUTF8_abi_cxx11_(String *__return_storage_ptr__,Json *this,uint cp)

{
  pointer pcVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  uVar4 = (uint)this;
  uVar3 = (ulong)this & 0xffffffff;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (uVar4 < 0x80) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  }
  else {
    bVar2 = (byte)uVar3;
    if (uVar4 < 0x800) {
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
      (__return_storage_ptr__->_M_dataplus)._M_p[1] = bVar2 & 0x3f | 0x80;
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      uVar3 = (ulong)(byte)((byte)(uVar4 >> 6) | 0xc0);
    }
    else if (uVar4 < 0x10000) {
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
      (__return_storage_ptr__->_M_dataplus)._M_p[2] = bVar2 & 0x3f | 0x80;
      (__return_storage_ptr__->_M_dataplus)._M_p[1] = (byte)(uVar3 >> 6) & 0x3f | 0x80;
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      uVar3 = (ulong)(byte)((byte)(uVar4 >> 0xc) | 0xe0);
    }
    else {
      if (0x10ffff < uVar4) {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
      (__return_storage_ptr__->_M_dataplus)._M_p[3] = bVar2 & 0x3f | 0x80;
      (__return_storage_ptr__->_M_dataplus)._M_p[2] = (byte)(uVar3 >> 6) & 0x3f | 0x80;
      (__return_storage_ptr__->_M_dataplus)._M_p[1] = (byte)(uVar3 >> 0xc) & 0x3f | 0x80;
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      uVar3 = (ulong)(byte)((byte)(uVar4 >> 0x12) | 0xf0);
    }
  }
  *pcVar1 = (char)uVar3;
  return __return_storage_ptr__;
}

Assistant:

static inline String codePointToUTF8(unsigned int cp) {
  String result;

  // based on description from http://en.wikipedia.org/wiki/UTF-8

  if (cp <= 0x7f) {
    result.resize(1);
    result[0] = static_cast<char>(cp);
  } else if (cp <= 0x7FF) {
    result.resize(2);
    result[1] = static_cast<char>(0x80 | (0x3f & cp));
    result[0] = static_cast<char>(0xC0 | (0x1f & (cp >> 6)));
  } else if (cp <= 0xFFFF) {
    result.resize(3);
    result[2] = static_cast<char>(0x80 | (0x3f & cp));
    result[1] = static_cast<char>(0x80 | (0x3f & (cp >> 6)));
    result[0] = static_cast<char>(0xE0 | (0xf & (cp >> 12)));
  } else if (cp <= 0x10FFFF) {
    result.resize(4);
    result[3] = static_cast<char>(0x80 | (0x3f & cp));
    result[2] = static_cast<char>(0x80 | (0x3f & (cp >> 6)));
    result[1] = static_cast<char>(0x80 | (0x3f & (cp >> 12)));
    result[0] = static_cast<char>(0xF0 | (0x7 & (cp >> 18)));
  }

  return result;
}